

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void check_match(LexState *ls,int what,int who,int where)

{
  int iVar1;
  LexState *ls_00;
  char *pcVar2;
  uint in_ECX;
  long in_RDI;
  LexState *in_stack_ffffffffffffffc8;
  lua_State *L;
  LexState *in_stack_ffffffffffffffd8;
  LexState *in_stack_ffffffffffffffe0;
  
  iVar1 = testnext(in_stack_ffffffffffffffc8,0);
  if (iVar1 == 0) {
    if (in_ECX == *(uint *)(in_RDI + 4)) {
      error_expected(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    }
    else {
      L = *(lua_State **)(in_RDI + 0x38);
      ls_00 = (LexState *)luaX_token2str(in_stack_ffffffffffffffd8,(int)((ulong)L >> 0x20));
      pcVar2 = luaX_token2str(ls_00,(int)((ulong)L >> 0x20));
      luaO_pushfstring(L,"\'%s\' expected (to close \'%s\' at line %d)",ls_00,pcVar2,(ulong)in_ECX);
      luaX_syntaxerror((LexState *)L,(char *)in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

static void check_match(LexState*ls,int what,int who,int where){
if(!testnext(ls,what)){
if(where==ls->linenumber)
error_expected(ls,what);
else{
luaX_syntaxerror(ls,luaO_pushfstring(ls->L,
LUA_QL("%s")" expected (to close "LUA_QL("%s")" at line %d)",
luaX_token2str(ls,what),luaX_token2str(ls,who),where));
}
}
}